

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O1

void print_summary(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  char extver [10];
  char extnv [71];
  char local_82 [10];
  char local_78 [72];
  
  set_hduerr(hduptr->hdunum);
  iVar2 = hduptr->hdutype;
  sprintf(comm," %d header keywords",(ulong)(uint)hduptr->nkeys);
  wrtout(out,comm);
  wrtout(out," ");
  if (iVar2 - 1U < 2) {
    strcpy(local_78,hduptr->extname);
    if (hduptr->extver != -999) {
      sprintf(local_82,"(%d)");
      strcat(local_78,local_82);
    }
    sprintf(comm," %s  (%d columns x %lld rows)",local_78,(ulong)(uint)hduptr->ncols,
            hduptr->naxes[1]);
    wrtout(out,comm);
    if (hduptr->ncols != 0) {
      wrtout(out," ");
      builtin_strncpy(comm," Col# Name (Units)       Format",0x20);
      wrtout(out,comm);
    }
    if (0 < hduptr->ncols) {
      uVar4 = 0;
      do {
        if (*tunit[uVar4] == '\0') {
          strcpy(local_78,ttype[uVar4]);
        }
        else {
          sprintf(local_78,"%s (%s)");
        }
        ppcVar1 = tform + uVar4;
        uVar4 = uVar4 + 1;
        sprintf(comm," %3d %-20.20s %-10.10s",uVar4 & 0xffffffff,local_78,*ppcVar1);
        wrtout(out,comm);
      } while ((long)uVar4 < (long)hduptr->ncols);
    }
    goto LAB_0010bcde;
  }
  if (iVar2 != 0) goto LAB_0010bcde;
  if (hduptr->isgroup == 0) {
    if (0 < hduptr->naxis) {
      if (hduptr->hdunum == 1) {
        local_78[0] = '\0';
      }
      else {
        strcpy(local_78,hduptr->extname);
        if (hduptr->extver != -999) {
          sprintf(local_82," (%d)");
          strcat(local_78,local_82);
        }
      }
      strcpy(comm,local_78);
      iVar2 = hduptr->bitpix;
      if (iVar2 < 0x14) {
        if (iVar2 < 8) {
          if (iVar2 == -0x40) {
            builtin_strncpy(temp + 0x10,"recision",8);
            uVar9._0_1_ = ' ';
            uVar9._1_1_ = '6';
            uVar9._2_1_ = '4';
            uVar9._3_1_ = '-';
            temp[8] = 'd';
            temp[9] = 'o';
            temp[10] = 'u';
            temp[0xb] = 'b';
            uVar13._0_1_ = 'l';
            uVar13._1_1_ = 'e';
            uVar13._2_1_ = ' ';
            uVar13._3_1_ = 'p';
            goto LAB_0010bbea;
          }
          if (iVar2 != -0x20) goto LAB_0010bbfc;
          builtin_strncpy(temp + 0x10," point pixels, ",0x10);
          uVar8._0_1_ = ' ';
          uVar8._1_1_ = '3';
          uVar8._2_1_ = '2';
          uVar8._3_1_ = '-';
          temp[8] = 'f';
          temp[9] = 'l';
          temp[10] = 'o';
          temp[0xb] = 'a';
          uVar12._0_1_ = 't';
          uVar12._1_1_ = 'i';
          uVar12._2_1_ = 'n';
          uVar12._3_1_ = 'g';
LAB_0010bb7a:
          builtin_strncpy(temp + 4,"bit ",4);
          temp[0] = (char)uVar8;
          temp[1] = SUB41(uVar8,1);
          temp[2] = SUB41(uVar8,2);
          temp[3] = SUB41(uVar8,3);
          temp._12_2_ = (undefined2)uVar12;
          temp._14_2_ = SUB42(uVar12,2);
        }
        else {
          if (iVar2 != 8) {
            if (iVar2 == 0x10) {
              builtin_strncpy(temp + 0x10,"pixels, ",9);
              uVar8._0_1_ = ' ';
              uVar8._1_1_ = '1';
              uVar8._2_1_ = '6';
              uVar8._3_1_ = '-';
              temp[8] = 'i';
              temp[9] = 'n';
              temp[10] = 't';
              temp[0xb] = 'e';
              uVar12._0_1_ = 'g';
              uVar12._1_1_ = 'e';
              uVar12._2_1_ = 'r';
              uVar12._3_1_ = ' ';
              goto LAB_0010bb7a;
            }
            goto LAB_0010bbfc;
          }
          builtin_strncpy(temp," 8-bit integer pixels, ",0x18);
        }
      }
      else {
        if (iVar2 < 0x28) {
          if (iVar2 == 0x14) {
            builtin_strncpy(temp + 0x10," integer",8);
            uVar9._0_1_ = ' ';
            uVar9._1_1_ = '1';
            uVar9._2_1_ = '6';
            uVar9._3_1_ = '-';
            temp[8] = 'u';
            temp[9] = 'n';
            temp[10] = 's';
            temp[0xb] = 'i';
            uVar13._0_1_ = 'g';
            uVar13._1_1_ = 'n';
            uVar13._2_1_ = 'e';
            uVar13._3_1_ = 'd';
LAB_0010bbea:
            builtin_strncpy(temp + 0x18," pixels, ",10);
            builtin_strncpy(temp + 4,"bit ",4);
            temp[0] = (char)uVar9;
            temp[1] = SUB41(uVar9,1);
            temp[2] = SUB41(uVar9,2);
            temp[3] = SUB41(uVar9,3);
            temp._12_2_ = (undefined2)uVar13;
            temp._14_2_ = SUB42(uVar13,2);
            goto LAB_0010bc14;
          }
          if (iVar2 == 0x20) {
            builtin_strncpy(temp + 0x10,"pixels, ",9);
            uVar8._0_1_ = ' ';
            uVar8._1_1_ = '3';
            uVar8._2_1_ = '2';
            uVar8._3_1_ = '-';
            temp[8] = 'i';
            temp[9] = 'n';
            temp[10] = 't';
            temp[0xb] = 'e';
            uVar12._0_1_ = 'g';
            uVar12._1_1_ = 'e';
            uVar12._2_1_ = 'r';
            uVar12._3_1_ = ' ';
            goto LAB_0010bb7a;
          }
        }
        else {
          if (iVar2 == 0x28) {
            builtin_strncpy(temp + 0x10," integer",8);
            uVar9._0_1_ = ' ';
            uVar9._1_1_ = '3';
            uVar9._2_1_ = '2';
            uVar9._3_1_ = '-';
            temp[8] = 'u';
            temp[9] = 'n';
            temp[10] = 's';
            temp[0xb] = 'i';
            uVar13._0_1_ = 'g';
            uVar13._1_1_ = 'n';
            uVar13._2_1_ = 'e';
            uVar13._3_1_ = 'd';
            goto LAB_0010bbea;
          }
          if (iVar2 == 0x40) {
            builtin_strncpy(temp + 0x10,"eger pixels, ",0xe);
            uVar8._0_1_ = ' ';
            uVar8._1_1_ = '6';
            uVar8._2_1_ = '4';
            uVar8._3_1_ = '-';
            temp[8] = 'l';
            temp[9] = 'o';
            temp[10] = 'n';
            temp[0xb] = 'g';
            uVar12._0_1_ = ' ';
            uVar12._1_1_ = 'i';
            uVar12._2_1_ = 'n';
            uVar12._3_1_ = 't';
            goto LAB_0010bb7a;
          }
        }
LAB_0010bbfc:
        builtin_strncpy(temp," unknown datatype, ",0x14);
      }
LAB_0010bc14:
      strcat(comm,temp);
      sprintf(temp," %d axes ",(ulong)(uint)hduptr->naxis);
      strcat(comm,temp);
      sprintf(temp,"(%lld",*hduptr->naxes);
      strcat(comm,temp);
      if (1 < hduptr->naxis) {
        lVar5 = 1;
        do {
          sprintf(temp," x %lld",hduptr->naxes[lVar5]);
          strcat(comm,temp);
          lVar5 = lVar5 + 1;
        } while (lVar5 < hduptr->naxis);
      }
      goto LAB_0010bcbd;
    }
    builtin_strncpy(comm + 0x10,"; NAXIS = 0 ",0xd);
    builtin_strncpy(comm," Null data array",0x10);
  }
  else {
    sprintf(comm," %d Random Groups, ",(ulong)(uint)hduptr->gcount);
    iVar2 = hduptr->bitpix;
    if (iVar2 < 0x14) {
      if (iVar2 < 8) {
        if (iVar2 == -0x40) {
          builtin_strncpy(temp + 0x10,"recision",8);
          uVar7._0_1_ = ' ';
          uVar7._1_1_ = '6';
          uVar7._2_1_ = '4';
          uVar7._3_1_ = '-';
          temp[8] = 'd';
          temp[9] = 'o';
          temp[10] = 'u';
          temp[0xb] = 'b';
          uVar11._0_1_ = 'l';
          uVar11._1_1_ = 'e';
          uVar11._2_1_ = ' ';
          uVar11._3_1_ = 'p';
          goto LAB_0010ba56;
        }
        if (iVar2 != -0x20) goto LAB_0010ba68;
        builtin_strncpy(temp + 0x10," point pixels, ",0x10);
        uVar6._0_1_ = ' ';
        uVar6._1_1_ = '3';
        uVar6._2_1_ = '2';
        uVar6._3_1_ = '-';
        temp[8] = 'f';
        temp[9] = 'l';
        temp[10] = 'o';
        temp[0xb] = 'a';
        uVar10._0_1_ = 't';
        uVar10._1_1_ = 'i';
        uVar10._2_1_ = 'n';
        uVar10._3_1_ = 'g';
LAB_0010b904:
        builtin_strncpy(temp + 4,"bit ",4);
        temp[0] = (char)uVar6;
        temp[1] = SUB41(uVar6,1);
        temp[2] = SUB41(uVar6,2);
        temp[3] = SUB41(uVar6,3);
        temp._12_2_ = (undefined2)uVar10;
        temp._14_2_ = SUB42(uVar10,2);
      }
      else {
        if (iVar2 != 8) {
          if (iVar2 == 0x10) {
            builtin_strncpy(temp + 0x10,"pixels, ",9);
            uVar6._0_1_ = ' ';
            uVar6._1_1_ = '1';
            uVar6._2_1_ = '6';
            uVar6._3_1_ = '-';
            temp[8] = 'i';
            temp[9] = 'n';
            temp[10] = 't';
            temp[0xb] = 'e';
            uVar10._0_1_ = 'g';
            uVar10._1_1_ = 'e';
            uVar10._2_1_ = 'r';
            uVar10._3_1_ = ' ';
            goto LAB_0010b904;
          }
          goto LAB_0010ba68;
        }
        builtin_strncpy(temp," 8-bit integer pixels, ",0x18);
      }
    }
    else {
      if (iVar2 < 0x28) {
        if (iVar2 == 0x14) {
          builtin_strncpy(temp + 0x10," integer",8);
          uVar7._0_1_ = ' ';
          uVar7._1_1_ = '1';
          uVar7._2_1_ = '6';
          uVar7._3_1_ = '-';
          temp[8] = 'u';
          temp[9] = 'n';
          temp[10] = 's';
          temp[0xb] = 'i';
          uVar11._0_1_ = 'g';
          uVar11._1_1_ = 'n';
          uVar11._2_1_ = 'e';
          uVar11._3_1_ = 'd';
LAB_0010ba56:
          builtin_strncpy(temp + 0x18," pixels, ",10);
          builtin_strncpy(temp + 4,"bit ",4);
          temp[0] = (char)uVar7;
          temp[1] = SUB41(uVar7,1);
          temp[2] = SUB41(uVar7,2);
          temp[3] = SUB41(uVar7,3);
          temp._12_2_ = (undefined2)uVar11;
          temp._14_2_ = SUB42(uVar11,2);
          goto LAB_0010ba80;
        }
        if (iVar2 == 0x20) {
          builtin_strncpy(temp + 0x10,"pixels, ",9);
          uVar6._0_1_ = ' ';
          uVar6._1_1_ = '3';
          uVar6._2_1_ = '2';
          uVar6._3_1_ = '-';
          temp[8] = 'i';
          temp[9] = 'n';
          temp[10] = 't';
          temp[0xb] = 'e';
          uVar10._0_1_ = 'g';
          uVar10._1_1_ = 'e';
          uVar10._2_1_ = 'r';
          uVar10._3_1_ = ' ';
          goto LAB_0010b904;
        }
      }
      else {
        if (iVar2 == 0x28) {
          builtin_strncpy(temp + 0x10," integer",8);
          uVar7._0_1_ = ' ';
          uVar7._1_1_ = '3';
          uVar7._2_1_ = '2';
          uVar7._3_1_ = '-';
          temp[8] = 'u';
          temp[9] = 'n';
          temp[10] = 's';
          temp[0xb] = 'i';
          uVar11._0_1_ = 'g';
          uVar11._1_1_ = 'n';
          uVar11._2_1_ = 'e';
          uVar11._3_1_ = 'd';
          goto LAB_0010ba56;
        }
        if (iVar2 == 0x40) {
          builtin_strncpy(temp + 0x10,"eger pixels, ",0xe);
          uVar6._0_1_ = ' ';
          uVar6._1_1_ = '6';
          uVar6._2_1_ = '4';
          uVar6._3_1_ = '-';
          temp[8] = 'l';
          temp[9] = 'o';
          temp[10] = 'n';
          temp[0xb] = 'g';
          uVar10._0_1_ = ' ';
          uVar10._1_1_ = 'i';
          uVar10._2_1_ = 'n';
          uVar10._3_1_ = 't';
          goto LAB_0010b904;
        }
      }
LAB_0010ba68:
      builtin_strncpy(temp," unknown datatype, ",0x14);
    }
LAB_0010ba80:
    strcat(comm,temp);
    sprintf(temp," %d axes ",(ulong)(uint)hduptr->naxis);
    strcat(comm,temp);
    sprintf(temp,"(%lld",*hduptr->naxes);
    strcat(comm,temp);
    if (1 < hduptr->naxis) {
      lVar5 = 1;
      do {
        sprintf(temp," x %lld",hduptr->naxes[lVar5]);
        strcat(comm,temp);
        lVar5 = lVar5 + 1;
      } while (lVar5 < hduptr->naxis);
    }
LAB_0010bcbd:
    sVar3 = strlen(comm);
    builtin_strncpy(comm + sVar3,"), ",4);
  }
  wrtout(out,comm);
LAB_0010bcde:
  wrtout(out," ");
  return;
}

Assistant:

void print_summary(fitsfile *infits, 	/* input fits file   */ 
	     FILE*	out,		/* output ascii file */
             FitsHdu *hduptr 
            ) 
{ 
   
    int i = 0;
    char extver[10];
    char extnv[FLEN_VALUE];
    long npix;
    int hdutype;

    /* get the error number and wrn number */ 
    set_hduerr(hduptr->hdunum);

    hdutype = hduptr->hdutype;
    sprintf(comm," %d header keywords", hduptr->nkeys);
    wrtout(out,comm);
    wrtout(out," ");
    if(hdutype == ASCII_TBL || hdutype== BINARY_TBL) {  
        sprintf(extnv, "%s",hduptr->extname);
        if (hduptr->extver!=-999) {
            sprintf(extver,"(%d)",hduptr->extver);
            strcat(extnv,extver);
        }

#if (USE_LL_SUFFIX == 1)
        sprintf(comm," %s  (%d columns x %lld rows)", extnv, hduptr->ncols,
           hduptr->naxes[1]);
#else
        sprintf(comm," %s  (%d columns x %ld rows)", extnv, hduptr->ncols,
           hduptr->naxes[1]);
#endif
        wrtout(out,comm);
        if(hduptr->ncols) {
           wrtout(out," ");
           sprintf(comm, " Col# Name (Units)       Format"); 
           wrtout(out,comm);
	}    
        for ( i = 0; i < hduptr->ncols; i++) {
           if(strlen(tunit[i]))  
               sprintf(extnv,"%s (%s)",ttype[i],tunit[i]); 
           else 
               sprintf(extnv,"%s",ttype[i]); 
 	   sprintf(comm," %3d %-20.20s %-10.10s",
              i+1, extnv, tform[i]);
	   wrtout(out,comm);
        }  
    }      
    else if(hdutype == IMAGE_HDU && hduptr->isgroup) { 

            sprintf(comm, " %d Random Groups, ",hduptr->gcount);

            switch(hduptr->bitpix) { 
            	case BYTE_IMG: 
               	    strcpy(temp," 8-bit integer pixels, ");
               	    break; 
                case SHORT_IMG: 
                   strcpy(temp," 16-bit integer pixels, ");
                   break; 
                case USHORT_IMG: 
                   strcpy(temp," 16-bit unsigned integer pixels, ");
                   break; 
                case LONG_IMG: 
                   strcpy(temp," 32-bit integer pixels, ");
                   break; 
                case LONGLONG_IMG: 
                   strcpy(temp," 64-bit long integer pixels, ");
                   break; 
                case ULONG_IMG: 
                   strcpy(temp," 32-bit unsigned integer pixels, ");
                   break; 
                case FLOAT_IMG: 
                   strcpy(temp," 32-bit floating point pixels, ");
                   break; 
                case DOUBLE_IMG: 
                   strcpy(temp," 64-bit double precision pixels, ");
                   break; 
                default: 
                   strcpy(temp," unknown datatype, ");
                   break; 
            }
	    strcat(comm,temp);

            sprintf(temp," %d axes ",hduptr->naxis);
	    strcat(comm,temp);

#if (USE_LL_SUFFIX == 1)
	    sprintf(temp, "(%lld",hduptr->naxes[0]);
#else
	    sprintf(temp, "(%ld",hduptr->naxes[0]);
#endif
	    strcat(comm,temp);

	    npix = hduptr->naxes[0];
	    for ( i = 1; i < hduptr->naxis; i++){ 
	       npix *= hduptr->naxes[i];
#if (USE_LL_SUFFIX == 1)
	       sprintf(temp, " x %lld",hduptr->naxes[i]);
#else
	       sprintf(temp, " x %ld",hduptr->naxes[i]);
#endif
	       strcat(comm,temp);
            }  
	    strcat(comm,"), ");
            wrtout(out,comm);
    }
    else if(hdutype == IMAGE_HDU) { 
        if(hduptr->naxis > 0) {

	    if(hduptr->hdunum == 1) {  
                strcpy(extnv,"");
            } else { 
                sprintf(extnv, "%s",hduptr->extname);
                if (hduptr->extver!=-999) {
                   sprintf(extver," (%d)",hduptr->extver);
                   strcat(extnv,extver);
                }
            }
	    strcpy(comm,extnv);

            switch(hduptr->bitpix) { 
            	case BYTE_IMG: 
               	    strcpy(temp," 8-bit integer pixels, ");
               	    break; 
                case SHORT_IMG: 
                   strcpy(temp," 16-bit integer pixels, ");
                   break; 
                case USHORT_IMG: 
                   strcpy(temp," 16-bit unsigned integer pixels, ");
                   break; 
                case LONG_IMG: 
                   strcpy(temp," 32-bit integer pixels, ");
                   break; 
                case LONGLONG_IMG: 
                   strcpy(temp," 64-bit long integer pixels, ");
                   break; 
                case ULONG_IMG: 
                   strcpy(temp," 32-bit unsigned integer pixels, ");
                   break; 
                case FLOAT_IMG: 
                   strcpy(temp," 32-bit floating point pixels, ");
                   break; 
                case DOUBLE_IMG: 
                   strcpy(temp," 64-bit double precision pixels, ");
                   break; 
                default: 
                   strcpy(temp," unknown datatype, ");
                   break; 
            }
	    strcat(comm,temp);

            sprintf(temp," %d axes ",hduptr->naxis);
	    strcat(comm,temp);

#if (USE_LL_SUFFIX == 1)
	    sprintf(temp, "(%lld",hduptr->naxes[0]);
#else
	    sprintf(temp, "(%ld",hduptr->naxes[0]);
#endif
	    strcat(comm,temp);

	    npix = hduptr->naxes[0];
	    for ( i = 1; i < hduptr->naxis; i++){ 
	       npix *= hduptr->naxes[i];
#if (USE_LL_SUFFIX == 1)
	       sprintf(temp, " x %lld",hduptr->naxes[i]);
#else
	       sprintf(temp, " x %ld",hduptr->naxes[i]);
#endif
	       strcat(comm,temp);
            }  
	    strcat(comm,"), ");
            wrtout(out,comm);
        }
        else{ 
            sprintf(comm," Null data array; NAXIS = 0 ");
            wrtout(out,comm);
        }       
    }
    wrtout(out," ");
    return;
}